

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p5_pbev2.cc
# Opt level: O0

int PKCS5_pbe2_encrypt_init
              (CBB *out,EVP_CIPHER_CTX *ctx,EVP_CIPHER *cipher,uint32_t iterations,char *pass,
              size_t pass_len,uint8_t *salt,size_t salt_len)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  EVP_MD *pbkdf2_md;
  undefined1 local_158 [8];
  CBB cipher_cbb;
  CBB kdf_param;
  CBB kdf;
  CBB param;
  CBB algorithm;
  uint8_t iv [16];
  int cipher_nid;
  size_t pass_len_local;
  char *pass_local;
  uint32_t iterations_local;
  EVP_CIPHER *cipher_local;
  EVP_CIPHER_CTX *ctx_local;
  CBB *out_local;
  
  iVar1 = EVP_CIPHER_nid((EVP_CIPHER *)cipher);
  if (iVar1 == 0) {
    ERR_put_error(0x13,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                  ,0x87);
    return 0;
  }
  iVar2 = EVP_CIPHER_iv_length((EVP_CIPHER *)cipher);
  iVar2 = RAND_bytes((uchar *)((long)&algorithm.u + 0x18),iVar2);
  if (iVar2 != 0) {
    iVar2 = CBB_add_asn1(out,(CBB *)((long)&param.u + 0x18),0x20000010);
    if (((((iVar2 != 0) &&
          (iVar2 = CBB_add_asn1_element((CBB *)((long)&param.u + 0x18),6,kPBES2,9), iVar2 != 0)) &&
         (iVar2 = CBB_add_asn1((CBB *)((long)&param.u + 0x18),(CBB *)((long)&kdf.u + 0x18),
                               0x20000010), iVar2 != 0)) &&
        ((iVar2 = CBB_add_asn1((CBB *)((long)&kdf.u + 0x18),(CBB *)((long)&kdf_param.u + 0x18),
                               0x20000010), iVar2 != 0 &&
         (iVar2 = CBB_add_asn1_element((CBB *)((long)&kdf_param.u + 0x18),6,kPBKDF2,9), iVar2 != 0))
        )) && ((iVar2 = CBB_add_asn1((CBB *)((long)&kdf_param.u + 0x18),
                                     (CBB *)((long)&cipher_cbb.u + 0x18),0x20000010), iVar2 != 0 &&
               ((iVar2 = CBB_add_asn1_octet_string
                                   ((CBB *)((long)&cipher_cbb.u + 0x18),salt,salt_len), iVar2 != 0
                && (iVar2 = CBB_add_asn1_uint64((CBB *)((long)&cipher_cbb.u + 0x18),
                                                (ulong)iterations), iVar2 != 0)))))) {
      if (iVar1 == 0x25) {
        uVar3 = EVP_CIPHER_key_length((EVP_CIPHER *)cipher);
        iVar2 = CBB_add_asn1_uint64((CBB *)((long)&cipher_cbb.u + 0x18),(ulong)uVar3);
        if (iVar2 == 0) {
          return 0;
        }
      }
      iVar2 = CBB_add_asn1((CBB *)((long)&kdf.u + 0x18),(CBB *)local_158,0x20000010);
      if ((iVar2 != 0) && (iVar1 = add_cipher_oid((CBB *)local_158,iVar1), iVar1 != 0)) {
        uVar3 = EVP_CIPHER_iv_length((EVP_CIPHER *)cipher);
        iVar1 = CBB_add_asn1_octet_string
                          ((CBB *)local_158,(uint8_t *)((long)&algorithm.u + 0x18),(ulong)uVar3);
        if ((iVar1 != 0) && (iVar1 = CBB_flush(out), iVar1 != 0)) {
          pbkdf2_md = EVP_sha1();
          uVar3 = EVP_CIPHER_iv_length((EVP_CIPHER *)cipher);
          iVar1 = pkcs5_pbe2_cipher_init
                            (ctx,cipher,(EVP_MD *)pbkdf2_md,iterations,pass,pass_len,salt,salt_len,
                             (uint8_t *)((long)&algorithm.u + 0x18),(ulong)uVar3,1);
          return iVar1;
        }
      }
    }
    return 0;
  }
  return 0;
}

Assistant:

int PKCS5_pbe2_encrypt_init(CBB *out, EVP_CIPHER_CTX *ctx,
                            const EVP_CIPHER *cipher, uint32_t iterations,
                            const char *pass, size_t pass_len,
                            const uint8_t *salt, size_t salt_len) {
  int cipher_nid = EVP_CIPHER_nid(cipher);
  if (cipher_nid == NID_undef) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_CIPHER_HAS_NO_OBJECT_IDENTIFIER);
    return 0;
  }

  // Generate a random IV.
  uint8_t iv[EVP_MAX_IV_LENGTH];
  if (!RAND_bytes(iv, EVP_CIPHER_iv_length(cipher))) {
    return 0;
  }

  // See RFC 2898, appendix A.
  CBB algorithm, param, kdf, kdf_param, cipher_cbb;
  if (!CBB_add_asn1(out, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&algorithm, CBS_ASN1_OBJECT, kPBES2,
                            sizeof(kPBES2)) ||
      !CBB_add_asn1(&algorithm, &param, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1(&param, &kdf, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&kdf, CBS_ASN1_OBJECT, kPBKDF2, sizeof(kPBKDF2)) ||
      !CBB_add_asn1(&kdf, &kdf_param, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_octet_string(&kdf_param, salt, salt_len) ||
      !CBB_add_asn1_uint64(&kdf_param, iterations) ||
      // Specify a key length for RC2.
      (cipher_nid == NID_rc2_cbc &&
       !CBB_add_asn1_uint64(&kdf_param, EVP_CIPHER_key_length(cipher))) ||
      // Omit the PRF. We use the default hmacWithSHA1.
      // TODO(crbug.com/396434682): Improve this defaults.
      !CBB_add_asn1(&param, &cipher_cbb, CBS_ASN1_SEQUENCE) ||
      !add_cipher_oid(&cipher_cbb, cipher_nid) ||
      // RFC 2898 says RC2-CBC and RC5-CBC-Pad use a SEQUENCE with version and
      // IV, but OpenSSL always uses an OCTET STRING IV, so we do the same.
      !CBB_add_asn1_octet_string(&cipher_cbb, iv,
                                 EVP_CIPHER_iv_length(cipher)) ||
      !CBB_flush(out)) {
    return 0;
  }

  return pkcs5_pbe2_cipher_init(ctx, cipher, EVP_sha1(), iterations, pass,
                                pass_len, salt, salt_len, iv,
                                EVP_CIPHER_iv_length(cipher), 1 /* encrypt */);
}